

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O1

void aom_highbd_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  uint uVar42;
  uint16_t uVar43;
  short *psVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar63 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  
  auVar3 = vpmovzxwd_avx(ZEXT416(*(uint *)dequant_ptr));
  auVar3 = vpmaddwd_avx(auVar3,_DAT_00515b60);
  auVar48._8_4_ = 0x40;
  auVar48._0_8_ = 0x4000000040;
  auVar48._12_4_ = 0x40;
  auVar3 = vpaddd_avx(auVar3,auVar48);
  auVar48 = vpsrad_avx(auVar3,7);
  auVar3 = vpmovsxwd_avx(ZEXT416(*(uint *)zbin_ptr));
  auVar51 = vpslld_avx(auVar3,5);
  auVar3 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
  auVar3 = vpaddd_avx(auVar51,auVar3);
  auVar3 = vpaddd_avx(auVar3,auVar48);
  auVar48 = vpshufd_avx(auVar3,0x55);
  auVar49._0_8_ = auVar48._0_8_;
  auVar49._8_8_ = auVar49._0_8_;
  auVar49._16_8_ = auVar49._0_8_;
  auVar49._24_8_ = auVar49._0_8_;
  auVar59 = vpblendd_avx2(auVar49,ZEXT1632(auVar3),1);
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  auVar58 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
  auVar53 = vpaddd_avx2(auVar58,auVar56);
  auVar54 = vpabsd_avx2(*(undefined1 (*) [32])coeff_ptr);
  auVar55 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar61 = vpslld_avx2(auVar54,5);
  auVar59 = vpcmpgtd_avx2(auVar61,auVar59);
  auVar61 = vpslld_avx2(auVar55,5);
  auVar61 = vpcmpgtd_avx2(auVar61,auVar49);
  auVar59 = vpackssdw_avx2(auVar59,auVar61);
  auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar36 = (auVar59 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar37 = (auVar59 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar35 = (auVar59 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar59 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar59 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar59 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar59 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = SUB321(auVar59 >> 0x7f,0) != '\0';
  bVar21 = (auVar59 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar59 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar59 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar59 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar59 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = SUB321(auVar59 >> 0xbf,0) != '\0';
  bVar13 = (auVar59 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar59 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar59 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar59 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar47 = auVar59[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) || bVar32) ||
                              bVar31) || bVar30) || bVar29) || bVar28) || bVar27) || bVar26) ||
                        bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
                 bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11
          ) || bVar10) || bVar9) || bVar8) || bVar7) || bVar47) {
    auVar59 = vpermq_avx2(auVar59,0xd8);
    auVar61 = vpand_avx2(auVar59,*(undefined1 (*) [32])iscan);
  }
  bVar47 = ((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) ||
                                    bVar32) || bVar31) || bVar30) || bVar29) || bVar28) || bVar27)
                              || bVar26) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                        bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
                 bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar47;
  auVar56 = vpcmpgtd_avx2(auVar56,auVar54);
  auVar6 = vpshufd_avx2(auVar53,0xee);
  auVar4 = vpcmpgtd_avx2(auVar55,auVar6);
  auVar59 = vpackssdw_avx2(auVar56 ^ auVar58,auVar4);
  auVar58 = vpermq_avx2(auVar59,0xd8);
  auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar37 = (auVar59 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar38 = (auVar59 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar36 = (auVar59 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar35 = (auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar59 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar59 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar59 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = SUB321(auVar59 >> 0x7f,0) != '\0';
  bVar22 = (auVar59 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = (auVar59 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar59 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar59 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar59 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = SUB321(auVar59 >> 0xbf,0) != '\0';
  bVar14 = (auVar59 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = (auVar59 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar59 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar59 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = auVar59[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar37 || bVar38) || bVar36) || bVar35) || bVar34) || bVar33) ||
                              bVar32) || bVar31) || bVar30) || bVar29) || bVar28) || bVar27) ||
                        bVar26) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                 bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12
          ) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) {
    auVar53 = vpand_avx2(auVar58,*(undefined1 (*) [32])iscan);
  }
  bVar7 = ((((((((((((((((((((((((((((((bVar37 || bVar38) || bVar36) || bVar35) || bVar34) || bVar33
                                   ) || bVar32) || bVar31) || bVar30) || bVar29) || bVar28) ||
                             bVar27) || bVar26) || bVar25) || bVar24) || bVar23) || bVar22) ||
                       bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) ||
                bVar14) || bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7;
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  auVar5 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  auVar50 = vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  if ((((((((((((((((((((((((((((((((auVar58 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar58 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar58 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar58 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar58 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar58 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar58 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar58 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar58 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar58 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar58 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar58 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar58 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar58 >> 0x7f,0) == '\0') &&
                    (auVar58 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar58 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar58 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar58 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar58 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar58 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar58 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar58 >> 0xbf,0) == '\0') &&
            (auVar58 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar58 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar58 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar58 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar58 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar58 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar58 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar58[0x1f]) {
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    local_108 = vpshufd_avx2(auVar59,0xee);
    local_168 = vpshufd_avx2(auVar5,0xee);
    local_188 = vpshufd_avx2(auVar57,0xee);
    local_128 = vpshufd_avx2(auVar50,0xee);
    dqcoeff_ptr[8] = 0;
    dqcoeff_ptr[9] = 0;
    dqcoeff_ptr[10] = 0;
    dqcoeff_ptr[0xb] = 0;
    dqcoeff_ptr[0xc] = 0;
    dqcoeff_ptr[0xd] = 0;
    dqcoeff_ptr[0xe] = 0;
    dqcoeff_ptr[0xf] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
  }
  else {
    auVar54 = vpaddd_avx2(auVar59,auVar54);
    auVar58 = vpmuldq_avx2(auVar54,auVar5);
    auVar63 = vpsrlq_avx2(auVar54,0x20);
    auVar62 = vpsrlq_avx2(auVar5,0x20);
    auVar62 = vpmuldq_avx2(auVar63,auVar62);
    auVar58 = vpsrlq_avx2(auVar58,0x10);
    auVar62 = vpsllq_avx2(auVar62,0x10);
    auVar58 = vpblendd_avx2(auVar58,auVar62,0xaa);
    auVar54 = vpaddd_avx2(auVar58,auVar54);
    auVar58 = vpmuldq_avx2(auVar54,auVar57);
    auVar54 = vpsrlq_avx2(auVar54,0x20);
    auVar62 = vpsrlq_avx2(auVar57,0x20);
    auVar54 = vpmuldq_avx2(auVar54,auVar62);
    auVar58 = vpsrlq_avx2(auVar58,0x10);
    auVar54 = vpsllq_avx2(auVar54,0x10);
    auVar58 = vpblendd_avx2(auVar58,auVar54,0xaa);
    local_108 = vpshufd_avx2(auVar59,0xee);
    local_168 = vpshufd_avx2(auVar5,0xee);
    local_188 = vpshufd_avx2(auVar57,0xee);
    auVar54 = vpaddd_avx2(auVar55,local_108);
    auVar55 = vpmuldq_avx2(auVar54,local_168);
    auVar59 = vpsrlq_avx2(auVar54,0x20);
    auVar62 = vpsrlq_avx2(local_168,0x20);
    auVar59 = vpmuldq_avx2(auVar59,auVar62);
    auVar55 = vpsrlq_avx2(auVar55,0x10);
    auVar59 = vpsllq_avx2(auVar59,0x10);
    auVar55 = vpblendd_avx2(auVar55,auVar59,0xaa);
    auVar54 = vpaddd_avx2(auVar55,auVar54);
    auVar55 = vpmuldq_avx2(auVar54,local_188);
    auVar54 = vpsrlq_avx2(auVar54,0x20);
    auVar59 = vpsrlq_avx2(local_188,0x20);
    auVar54 = vpmuldq_avx2(auVar54,auVar59);
    auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar55 = vpsrlq_avx2(auVar55,0x10);
    auVar54 = vpsllq_avx2(auVar54,0x10);
    auVar55 = vpblendd_avx2(auVar55,auVar54,0xaa);
    auVar54 = vpsignd_avx2(auVar58,*(undefined1 (*) [32])coeff_ptr);
    auVar59 = vpsignd_avx2(auVar55,*(undefined1 (*) [32])(coeff_ptr + 8));
    auVar55 = vpandn_avx2(auVar56,auVar54);
    auVar54 = vpand_avx2(auVar4,auVar59);
    *(undefined1 (*) [32])qcoeff_ptr = auVar55;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar54;
    auVar55 = vpmulld_avx2(auVar55,auVar50);
    local_128 = vpshufd_avx2(auVar50,0xee);
    auVar54 = vpmulld_avx2(auVar54,local_128);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar55;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar54;
  }
  auVar54 = vpmaxsw_avx2(auVar61,auVar62);
  auVar55 = vpmaxsw_avx2(auVar53,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  if (0x10 < n_coeffs) {
    auVar53 = vpsrad_avx2(local_168,0x1f);
    auVar59 = vpshufd_avx2(local_168,0xf5);
    auVar53 = vpblendd_avx2(auVar59,auVar53,0xaa);
    auVar61 = vpsrad_avx2(local_188,0x1f);
    auVar59 = vpshufd_avx2(local_188,0xf5);
    auVar59 = vpblendd_avx2(auVar59,auVar61,0xaa);
    lVar40 = 0x10;
    do {
      auVar61 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar40));
      auVar58 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar40 + 8));
      auVar56 = vpslld_avx2(auVar61,5);
      auVar56 = vpcmpgtd_avx2(auVar56,auVar49);
      auVar62 = vpslld_avx2(auVar58,5);
      auVar62 = vpcmpgtd_avx2(auVar62,auVar49);
      auVar56 = vpackssdw_avx2(auVar56,auVar62);
      auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar56 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar56 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar56 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar56 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar56 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar56 >> 0x2f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar56 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar56 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar56 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar56 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar56 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar56 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar56 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar56 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar56 >> 0x7f,0) != '\0') ||
                        (auVar56 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar56 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar56 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar56 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar56 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar56 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar56 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar56 >> 0xbf,0) != '\0') ||
                (auVar56 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar56 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar56 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar56 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar56 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar56 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar56 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          auVar56[0x1f] < '\0') {
        auVar56 = vpermq_avx2(auVar56,0xd8);
        auVar62 = vpand_avx2(auVar56,*(undefined1 (*) [32])(iscan + lVar40));
        bVar47 = true;
      }
      auVar4 = vpcmpgtd_avx2(auVar61,auVar6);
      auVar5 = vpcmpgtd_avx2(auVar58,auVar6);
      auVar56 = vpackssdw_avx2(auVar4,auVar5);
      auVar50 = vpermq_avx2(auVar56,0xd8);
      if ((((((((((((((((((((((((((((((((auVar56 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar56 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar56 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar56 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar56 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar56 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar56 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar56 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar56 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar56 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar56 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar56 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar56 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0x7f,0) == '\0') &&
                        (auVar56 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar56 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar56 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar56 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar56 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar56 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar56 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar56 >> 0xbf,0) == '\0') &&
                (auVar56 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar56 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar56 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar56 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar56 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar56 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar56 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar56[0x1f])
      {
        auVar56 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar56 = vpand_avx2(auVar50,*(undefined1 (*) [32])(iscan + lVar40));
        bVar7 = true;
      }
      if ((((((((((((((((((((((((((((((((auVar50 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar50 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar50 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar50 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar50 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar50 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar50 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar50 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar50 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar50 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar50 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar50 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar50 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar50 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar50 >> 0x7f,0) == '\0') &&
                        (auVar50 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar50 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar50 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar50 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar50 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar50 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar50 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar50 >> 0xbf,0) == '\0') &&
                (auVar50 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar50 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar50 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar50 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar50 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar50 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar50 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar50[0x1f])
      {
        ptVar1 = qcoeff_ptr + lVar40 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = qcoeff_ptr + lVar40;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar40 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar40;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
      }
      else {
        auVar61 = vpaddd_avx2(local_108,auVar61);
        auVar57 = vpmuldq_avx2(auVar61,local_168);
        auVar63 = vpsrad_avx2(auVar61,0x1f);
        auVar60 = vpshufd_avx2(auVar61,0xf5);
        auVar52 = vpsrlq_avx2(auVar53,0x20);
        auVar50 = vpmuludq_avx2(auVar60,auVar52);
        auVar63 = vpsrlq_avx2(auVar63,0x20);
        auVar63 = vpmuludq_avx2(auVar53,auVar63);
        auVar50 = vpaddq_avx2(auVar50,auVar63);
        auVar63 = vpsllq_avx2(auVar50,0x20);
        auVar50 = vpmuludq_avx2(auVar53,auVar60);
        auVar50 = vpaddq_avx2(auVar50,auVar63);
        auVar57 = vpsrlq_avx2(auVar57,0x10);
        auVar50 = vpsllq_avx2(auVar50,0x10);
        auVar50 = vpblendd_avx2(auVar57,auVar50,0xaa);
        auVar61 = vpaddd_avx2(auVar50,auVar61);
        auVar57 = vpsrad_avx2(auVar61,0x1f);
        auVar63 = vpshufd_avx2(auVar61,0xf5);
        auVar60 = vpsrlq_avx2(auVar59,0x20);
        auVar50 = vpmuludq_avx2(auVar63,auVar60);
        auVar57 = vpsrlq_avx2(auVar57,0x20);
        auVar57 = vpmuludq_avx2(auVar59,auVar57);
        auVar50 = vpaddq_avx2(auVar50,auVar57);
        auVar57 = vpmuldq_avx2(auVar61,local_188);
        auVar50 = vpsllq_avx2(auVar50,0x20);
        auVar61 = vpmuludq_avx2(auVar59,auVar63);
        auVar61 = vpaddq_avx2(auVar61,auVar50);
        auVar50 = vpsrlq_avx2(auVar57,0x10);
        auVar61 = vpsllq_avx2(auVar61,0x10);
        auVar63 = vpblendd_avx2(auVar50,auVar61,0xaa);
        auVar61 = vpaddd_avx2(local_108,auVar58);
        auVar50 = vpsrad_avx2(auVar61,0x1f);
        auVar57 = vpshufd_avx2(auVar61,0xf5);
        auVar58 = vpmuludq_avx2(auVar57,auVar52);
        auVar50 = vpsrlq_avx2(auVar50,0x20);
        auVar50 = vpmuludq_avx2(auVar53,auVar50);
        auVar58 = vpaddq_avx2(auVar58,auVar50);
        auVar50 = vpsllq_avx2(auVar58,0x20);
        auVar58 = vpmuludq_avx2(auVar53,auVar57);
        auVar58 = vpaddq_avx2(auVar58,auVar50);
        auVar50 = vpmuldq_avx2(auVar61,local_168);
        auVar50 = vpsrlq_avx2(auVar50,0x10);
        auVar58 = vpsllq_avx2(auVar58,0x10);
        auVar58 = vpblendd_avx2(auVar50,auVar58,0xaa);
        auVar61 = vpaddd_avx2(auVar58,auVar61);
        auVar50 = vpsrad_avx2(auVar61,0x1f);
        auVar57 = vpshufd_avx2(auVar61,0xf5);
        auVar58 = vpmuludq_avx2(auVar57,auVar60);
        auVar50 = vpsrlq_avx2(auVar50,0x20);
        auVar50 = vpmuludq_avx2(auVar59,auVar50);
        auVar58 = vpaddq_avx2(auVar58,auVar50);
        auVar50 = vpsllq_avx2(auVar58,0x20);
        auVar58 = vpmuludq_avx2(auVar59,auVar57);
        auVar58 = vpaddq_avx2(auVar58,auVar50);
        auVar61 = vpmuldq_avx2(auVar61,local_188);
        auVar61 = vpsrlq_avx2(auVar61,0x10);
        auVar58 = vpsllq_avx2(auVar58,0x10);
        auVar58 = vpblendd_avx2(auVar61,auVar58,0xaa);
        auVar61 = vpsignd_avx2(auVar63,*(undefined1 (*) [32])(coeff_ptr + lVar40));
        auVar58 = vpsignd_avx2(auVar58,*(undefined1 (*) [32])(coeff_ptr + lVar40 + 8));
        auVar61 = vpand_avx2(auVar4,auVar61);
        auVar58 = vpand_avx2(auVar5,auVar58);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar40) = auVar61;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar40 + 8) = auVar58;
        auVar61 = vpmulld_avx2(auVar61,local_128);
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar40) = auVar61;
        auVar61 = vpmulld_avx2(auVar58,local_128);
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar40 + 8) = auVar61;
      }
      auVar54 = vpmaxsw_avx2(auVar62,auVar54);
      auVar55 = vpmaxsw_avx2(auVar56,auVar55);
      lVar40 = lVar40 + 0x10;
    } while (lVar40 < n_coeffs);
  }
  if (bVar47) {
    auVar3 = vpmaxsw_avx(auVar54._0_16_,auVar54._16_16_);
    auVar48 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmaxsw_avx(auVar48,auVar3);
    auVar48 = vpshufd_avx(auVar3,1);
    auVar3 = vpmaxsw_avx(auVar48,auVar3);
    auVar48 = vpsrld_avx(auVar3,0x10);
    auVar3 = vpmaxsw_avx(auVar3,auVar48);
    iVar41 = vpextrw_avx(auVar3,0);
    uVar42 = iVar41 + 1;
  }
  else {
    uVar42 = 0;
  }
  if (bVar7) {
    auVar3 = vpmaxsw_avx(auVar55._0_16_,auVar55._16_16_);
    auVar48 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmaxsw_avx(auVar48,auVar3);
    auVar48 = vpshufd_avx(auVar3,1);
    auVar3 = vpmaxsw_avx(auVar48,auVar3);
    auVar48 = vpsrld_avx(auVar3,0x10);
    auVar3 = vpmaxsw_avx(auVar3,auVar48);
    uVar39 = vpextrw_avx(auVar3,0);
  }
  else {
    uVar39 = 0xffffffff;
  }
  if ((int)uVar42 <= (int)uVar39) {
    iVar41 = uVar39 + 1;
    psVar44 = scan + uVar39;
    do {
      sVar2 = *psVar44;
      qcoeff_ptr[sVar2] = 0;
      dqcoeff_ptr[sVar2] = 0;
      iVar41 = iVar41 + -1;
      psVar44 = psVar44 + -1;
    } while ((int)uVar42 < iVar41);
  }
  uVar45 = 0xffffffff;
  uVar46 = (ulong)uVar42;
  do {
    iVar41 = (int)uVar45;
    if ((long)uVar46 < 1) break;
    lVar40 = uVar46 - 1;
    uVar46 = uVar46 - 1;
    if (qcoeff_ptr[scan[lVar40]] != 0) {
      uVar45 = uVar46 & 0xffffffff;
    }
    iVar41 = (int)uVar45;
  } while (qcoeff_ptr[scan[lVar40]] == 0);
  uVar43 = (uint16_t)(iVar41 + 1U);
  *eob_ptr = uVar43;
  if (uVar42 == 0) {
    uVar39 = 0xffffffff;
  }
  else {
    lVar40 = 0;
    do {
      uVar39 = (uint)lVar40;
      if (qcoeff_ptr[scan[lVar40]] != 0) break;
      bVar47 = (ulong)uVar42 - 1 != lVar40;
      lVar40 = lVar40 + 1;
      uVar39 = 0xffffffff;
    } while (bVar47);
  }
  if ((uVar43 != 0) && (uVar42 = (iVar41 + 1U & 0xffff) - 1, uVar39 == uVar42)) {
    sVar2 = scan[uVar42];
    if (((qcoeff_ptr[sVar2] == 1) || (qcoeff_ptr[sVar2] == -1)) &&
       (uVar42 = coeff_ptr[sVar2] >> 0x1f, uVar46 = (ulong)((uint)(sVar2 != 0) * 2),
       (int)((coeff_ptr[sVar2] << 5 ^ uVar42) - uVar42) <
       *(short *)((long)zbin_ptr + uVar46) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar46) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar2] = 0;
      dqcoeff_ptr[sVar2] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const int log_scale = 0;
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  highbd_load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr,
                            &quant, dequant_ptr, &dequant, quant_shift_ptr,
                            &shift);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}